

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandDsdFree(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  void *pvVar3;
  char *pcVar4;
  
  bVar1 = false;
  Extra_UtilGetoptReset();
  while (iVar2 = Extra_UtilGetopt(argc,argv,"bh"), iVar2 == 0x62) {
    bVar1 = (bool)(bVar1 ^ 1);
  }
  if (iVar2 == -1) {
    if (bVar1) {
      pvVar3 = Abc_FrameReadManDsd2();
      if (pvVar3 != (void *)0x0) {
        Abc_FrameSetManDsd2((void *)0x0);
        return 0;
      }
    }
    else {
      pvVar3 = Abc_FrameReadManDsd();
      if (pvVar3 != (void *)0x0) {
        Abc_FrameSetManDsd((void *)0x0);
        return 0;
      }
    }
    iVar2 = 0;
    Abc_Print(-1,"The DSD manager is not started.\n");
  }
  else {
    Abc_Print(-2,"usage: dsd_free [-bh]\n");
    Abc_Print(-2,"\t         deletes DSD manager\n");
    pcVar4 = "yes";
    if (!bVar1) {
      pcVar4 = "no";
    }
    Abc_Print(-2,"\t-b     : toggles processing second manager [default = %s]\n",pcVar4);
    Abc_Print(-2,"\t-h     : print the command usage\n");
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int Abc_CommandDsdFree( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c, fSecond = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "bh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'b':
            fSecond ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( fSecond )
    {
        if ( !Abc_FrameReadManDsd2() )
        {
            Abc_Print( -1, "The DSD manager is not started.\n" );
            return 0;
        }
        Abc_FrameSetManDsd2( NULL );
    }
    else
    {
        if ( !Abc_FrameReadManDsd() )
        {
            Abc_Print( -1, "The DSD manager is not started.\n" );
            return 0;
        }
        Abc_FrameSetManDsd( NULL );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: dsd_free [-bh]\n" );
    Abc_Print( -2, "\t         deletes DSD manager\n" );
    Abc_Print( -2, "\t-b     : toggles processing second manager [default = %s]\n", fSecond? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}